

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo3.cpp
# Opt level: O2

int64_t primecount::pi_lmo3(int64_t x)

{
  int iVar1;
  int iVar2;
  undefined1 x_00 [16];
  bool bVar3;
  ulong uVar4;
  int64_t iVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int64_t b;
  long lVar11;
  long lVar12;
  long res;
  ulong uVar13;
  long lVar14;
  undefined1 in_R9B;
  ulong uVar15;
  long lVar16;
  long lVar17;
  size_t size;
  long lVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  type primes;
  int local_114;
  long local_110;
  Vector<bool,_std::allocator<bool>_> sieve;
  Vector<long,_std::allocator<long>_> phi;
  Vector<long,_std::allocator<long>_> next;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  
  if (x < 2) {
    iVar5 = 0;
  }
  else {
    x_00._8_8_ = in_stack_fffffffffffffec0;
    x_00._0_8_ = in_stack_fffffffffffffeb8;
    dVar20 = get_alpha_lmo((primecount *)x,(maxint_t)x_00);
    dVar21 = cbrt((double)x);
    uVar13 = (ulong)dVar21;
    uVar8 = (long)uVar13 >> 0x3f & uVar13;
    for (; (uVar4 = uVar8, 0 < (long)uVar13 &&
           (uVar4 = uVar13,
           uVar13 * uVar13 - (ulong)x / uVar13 != 0 &&
           (long)((ulong)x / uVar13) <= (long)(uVar13 * uVar13))); uVar13 = uVar13 - 1) {
    }
    lVar9 = uVar4 - 1;
    do {
      lVar17 = lVar9 + 2;
      lVar9 = lVar9 + 1;
    } while (lVar17 * lVar17 - x / lVar17 == 0 || lVar17 * lVar17 < x / lVar17);
    uVar8 = (ulong)(dVar20 * (double)lVar9);
    if (uVar8 < 0x14) {
      uVar13 = (ulong)(byte)PhiTiny::pi[uVar8];
    }
    else {
      uVar13 = 8;
    }
    generate_primes_i32(&primes,uVar8);
    generate_lpf(&lpf,uVar8);
    generate_moebius(&mu,uVar8);
    lVar9 = (long)primes.end_ - (long)primes.array_;
    bVar3 = is_print();
    lVar17 = (lVar9 >> 2) + -1;
    uVar4 = P2((primecount *)x,uVar8,lVar17,1,(uint)bVar3,(bool)in_R9B);
    bVar3 = is_print();
    iVar5 = S1(x,uVar8,uVar13,1,bVar3);
    lVar9 = x / (long)uVar8;
    dVar20 = (double)lVar9;
    if (dVar20 < 0.0) {
      dVar20 = sqrt(dVar20);
    }
    else {
      dVar20 = SQRT(dVar20);
    }
    size = 0xb504f333;
    if ((long)dVar20 < 0xb504f333) {
      size = (long)dVar20;
    }
    if (lVar9 < (long)(size * size)) {
      do {
        size = size - 1;
      } while (size * size - lVar9 != 0 && lVar9 <= (long)(size * size));
    }
    else {
      lVar12 = size * 2;
      if (lVar12 < (long)(lVar9 - size * size)) {
        do {
          size = size + 1;
          lVar12 = lVar12 + 2;
        } while (lVar12 < (long)(lVar9 - size * size));
      }
    }
    Vector<bool,_std::allocator<bool>_>::Vector(&sieve,size);
    Vector<long,_std::allocator<long>_>::Vector(&next,(long)primes.end_ - (long)primes.array_ >> 2);
    Vector<long,_std::allocator<long>_>::Vector(&phi,(long)primes.end_ - (long)primes.array_ >> 2);
    std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<int_const*,long*>
              (primes.array_,primes.end_,next.array_);
    for (plVar6 = phi.array_; plVar6 != phi.end_; plVar6 = plVar6 + 1) {
      *plVar6 = 0;
    }
    lVar12 = -1;
    local_110 = 0;
    lVar10 = 1;
    while (lVar10 < lVar9) {
      lVar18 = size + lVar10;
      lVar19 = lVar18;
      if (lVar9 < lVar18) {
        lVar19 = lVar9;
      }
      local_114 = 1;
      std::__fill_a1<bool*,int>(sieve.array_,sieve.end_,&local_114);
      for (lVar11 = 1; lVar11 != uVar13 + 1; lVar11 = lVar11 + 1) {
        iVar1 = primes.array_[lVar11];
        for (lVar14 = next.array_[lVar11]; lVar14 < lVar19; lVar14 = lVar14 + iVar1) {
          sieve.array_[lVar14 + lVar12] = false;
        }
        next.array_[lVar11] = lVar14;
      }
      uVar15 = uVar13;
      while (uVar15 = uVar15 + 1, (long)uVar15 < lVar17) {
        iVar1 = primes.array_[uVar15];
        lVar16 = (long)iVar1;
        lVar14 = x / (lVar19 * lVar16);
        lVar11 = (long)uVar8 / lVar16;
        if ((long)uVar8 / lVar16 < lVar14) {
          lVar11 = lVar14;
        }
        uVar7 = x / (lVar10 * lVar16);
        if ((long)uVar8 <= (long)uVar7) {
          uVar7 = uVar8;
        }
        if ((long)uVar7 <= lVar16) break;
        lVar14 = 0;
        for (; lVar11 < (long)uVar7; uVar7 = uVar7 - 1) {
          iVar2 = mu.array_[uVar7];
          if (((long)iVar2 != 0) && (iVar1 < lpf.array_[uVar7])) {
            for (; lVar14 <= x / (long)(uVar7 * lVar16) - lVar10; lVar14 = lVar14 + 1) {
              phi.array_[uVar15] = phi.array_[uVar15] + (ulong)sieve.array_[lVar14];
            }
            local_110 = local_110 - (long)iVar2 * phi.array_[uVar15];
          }
        }
        for (; lVar14 < lVar19 - lVar10; lVar14 = lVar14 + 1) {
          phi.array_[uVar15] = phi.array_[uVar15] + (ulong)sieve.array_[lVar14];
        }
        for (lVar11 = next.array_[uVar15]; lVar11 < lVar19; lVar11 = lVar11 + lVar16 * 2) {
          sieve.array_[lVar11 + lVar12] = false;
        }
        next.array_[uVar15] = lVar11;
      }
      lVar12 = lVar12 - size;
      lVar10 = lVar18;
    }
    Vector<long,_std::allocator<long>_>::~Vector(&phi);
    Vector<long,_std::allocator<long>_>::~Vector(&next);
    Vector<bool,_std::allocator<bool>_>::~Vector(&sieve);
    iVar5 = iVar5 + local_110 + lVar17 + ~uVar4;
    Vector<int,_std::allocator<int>_>::~Vector(&mu);
    Vector<int,_std::allocator<int>_>::~Vector(&lpf);
    Vector<int,_std::allocator<int>_>::~Vector(&primes);
  }
  return iVar5;
}

Assistant:

int64_t pi_lmo3(int64_t x)
{
  if (x < 2)
    return 0;

  int threads = 1;
  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);
  int64_t s1 = S1(x, y, c, threads);
  int64_t s2 = S2(x, y, c, pi_y, primes, lpf, mu);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}